

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O1

Move<vk::Handle<(vk::HandleType)16>_> *
vkt::tessellation::makePipelineLayoutWithoutDescriptors
          (Move<vk::Handle<(vk::HandleType)16>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device)

{
  VkPipelineLayoutCreateInfo info;
  VkPipelineLayoutCreateInfo local_38;
  
  local_38.pNext = (void *)0x0;
  local_38.pushConstantRangeCount = 0;
  local_38._36_4_ = 0;
  local_38.pPushConstantRanges = (VkPushConstantRange *)0x0;
  local_38.flags = 0;
  local_38.setLayoutCount = 0;
  local_38.pSetLayouts = (VkDescriptorSetLayout *)0x0;
  local_38.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  local_38._4_4_ = 0;
  ::vk::createPipelineLayout
            (__return_storage_ptr__,vk,device,&local_38,(VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipelineLayout> makePipelineLayoutWithoutDescriptors (const DeviceInterface&		vk,
															 const VkDevice				device)
{
	const VkPipelineLayoutCreateInfo info =
	{
		VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,		// VkStructureType				sType;
		DE_NULL,											// const void*					pNext;
		(VkPipelineLayoutCreateFlags)0,						// VkPipelineLayoutCreateFlags	flags;
		0u,													// deUint32						setLayoutCount;
		DE_NULL,											// const VkDescriptorSetLayout*	pSetLayouts;
		0u,													// deUint32						pushConstantRangeCount;
		DE_NULL,											// const VkPushConstantRange*	pPushConstantRanges;
	};
	return createPipelineLayout(vk, device, &info);
}